

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer_n.c
# Opt level: O2

void dump_symbol_name_list(TextBuffer *buf,LuaSymbolList *list,int level,char *delimiter)

{
  LuaSymbol *sym;
  bool bVar1;
  PtrListIterator nodeiter__;
  PtrListIterator PStack_48;
  
  raviX_ptrlist_forward_iterator(&PStack_48,(PtrList *)list);
  bVar1 = true;
  while( true ) {
    sym = (LuaSymbol *)raviX_ptrlist_iter_next(&PStack_48);
    if (sym == (LuaSymbol *)0x0) break;
    if (bVar1) {
      printf_buf(buf,"%p",(ulong)(uint)level);
    }
    else {
      printf_buf(buf,"%p%s",(ulong)(uint)level,",");
    }
    dump_symbol_name(buf,sym);
    bVar1 = false;
    printf_buf(buf,"\n");
  }
  return;
}

Assistant:

static void dump_symbol_name_list(TextBuffer *buf, LuaSymbolList *list, int level, const char *delimiter)
{
	LuaSymbol *node;
	bool is_first = true;
	FOR_EACH_PTR(list, LuaSymbol, node)
	{
		if (is_first || !delimiter) {
			printf_buf(buf, "%p", level);
			is_first = false;
		}
		else {
			printf_buf(buf, "%p%s", level, delimiter);
		}
		dump_symbol_name(buf, node);
		printf_buf(buf, "\n");
	}
	END_FOR_EACH_PTR(node);
}